

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load-balance-sampling.hpp
# Opt level: O1

void diy::detail::recv_req
               (AuxBlock *param_1,ProxyWithLink *cp,vector<int,_std::allocator<int>_> *req_procs)

{
  _Rb_tree_header *p_Var1;
  iterator __position;
  _Base_ptr p_Var2;
  mapped_type *pmVar3;
  ulong uVar4;
  IncomingQueues *this;
  int gid;
  vector<int,_std::allocator<int>_> incoming_gids;
  int v;
  int local_60;
  int local_5c;
  int *local_58;
  iterator iStack_50;
  int *local_48;
  undefined1 local_34 [4];
  
  local_58 = (int *)0x0;
  iStack_50._M_current = (int *)0x0;
  local_48 = (int *)0x0;
  p_Var2 = (cp->super_Proxy).incoming_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(cp->super_Proxy).incoming_._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var1) {
    do {
      if (iStack_50._M_current == local_48) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_58,iStack_50,(int *)(p_Var2 + 1));
      }
      else {
        *iStack_50._M_current = p_Var2[1]._M_color;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var1);
  }
  if (iStack_50._M_current != local_58) {
    this = &(cp->super_Proxy).incoming_;
    uVar4 = 0;
    do {
      local_60 = local_58[uVar4];
      local_5c = local_60;
      pmVar3 = std::
               map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
               ::operator[](this,&local_5c);
      if ((pmVar3->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (pmVar3->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_5c = local_60;
        pmVar3 = std::
                 map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                 ::operator[](this,&local_5c);
        (*(pmVar3->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar3,local_34,4);
        __position._M_current =
             (req_procs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (req_procs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)req_procs,__position,&local_60);
        }
        else {
          *__position._M_current = local_60;
          (req_procs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
          ._M_finish = __position._M_current + 1;
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)iStack_50._M_current - (long)local_58 >> 2));
  }
  if (local_58 != (int *)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  return;
}

Assistant:

inline void recv_req(AuxBlock*,                                // local block (unused)
              const diy::Master::ProxyWithLink& cp,     // communication proxy for neighbor blocks
              std::vector<int>& req_procs)              // processes requesting work info
{
    std::vector<int> incoming_gids;
    cp.incoming(incoming_gids);

    // for anything incoming, dequeue data received in the last exchange
    for (int i = 0; i < incoming_gids.size(); i++)
    {
        int gid = incoming_gids[i];
        if (cp.incoming(gid).size())
        {
            int v;
            cp.dequeue(gid, v);
            req_procs.push_back(gid);                   // aux_master has 1 gid per proc, so gid = proc
        }
    }
}